

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpagelayout.cpp
# Opt level: O3

bool __thiscall
QPageLayout::setLeftMargin(QPageLayout *this,qreal leftMargin,OutOfBoundsPolicy outOfBoundsPolicy)

{
  QPageLayoutPrivate *pQVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  pQVar1 = (this->d).d.ptr;
  if (outOfBoundsPolicy == Clamp && pQVar1->m_mode == StandardMode) {
    dVar6 = (pQVar1->m_maxMargins).m_left;
    if (leftMargin <= dVar6) {
      dVar6 = leftMargin;
    }
    dVar8 = (pQVar1->m_minMargins).m_left;
    leftMargin = dVar6;
    if (dVar6 <= dVar8) {
      leftMargin = dVar8;
    }
  }
  dVar6 = (pQVar1->m_margins).m_left;
  dVar7 = leftMargin - dVar6;
  uVar3 = -(ulong)(dVar7 < -dVar7);
  uVar4 = -(ulong)(leftMargin < -leftMargin);
  uVar5 = -(ulong)(dVar6 < -dVar6);
  dVar8 = (double)(~uVar4 & (ulong)leftMargin | (ulong)-leftMargin & uVar4);
  dVar6 = (double)(~uVar5 & (ulong)dVar6 | (ulong)-dVar6 & uVar5);
  if (dVar6 <= dVar8) {
    dVar8 = dVar6;
  }
  bVar2 = true;
  if (dVar8 < (double)(~uVar3 & (ulong)dVar7 | (ulong)-dVar7 & uVar3) * 1000000000000.0) {
    if ((pQVar1->m_mode == FullPageMode) ||
       (((pQVar1->m_minMargins).m_left <= leftMargin &&
        (leftMargin <= (pQVar1->m_maxMargins).m_left)))) {
      if ((__atomic_base<int>)
          *(__int_type *)
           &(pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
            ._q_value != (__atomic_base<int>)0x1) {
        QExplicitlySharedDataPointer<QPageLayoutPrivate>::detach_helper(&this->d);
        pQVar1 = (this->d).d.ptr;
      }
      (pQVar1->m_margins).m_left = leftMargin;
    }
    else {
      bVar2 = false;
    }
  }
  return bVar2;
}

Assistant:

bool QPageLayout::setLeftMargin(qreal leftMargin, OutOfBoundsPolicy outOfBoundsPolicy)
{
    if (d->m_mode == StandardMode && outOfBoundsPolicy == OutOfBoundsPolicy::Clamp)
        leftMargin = qBound(d->m_minMargins.left(), leftMargin, d->m_maxMargins.left());

    if (qFuzzyCompare(leftMargin, d->m_margins.left()))
        return true;

    if (d->m_mode == FullPageMode
        || (leftMargin >= d->m_minMargins.left() && leftMargin <= d->m_maxMargins.left())) {
        d.detach();
        d->m_margins.setLeft(leftMargin);
        return true;
    }

    return false;
}